

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O2

int get_int_options(char *json_string,char *option_name,int *result)

{
  int iVar1;
  json_t *root;
  longlong lVar2;
  
  *result = -1;
  root = get_root_option_json_object(json_string);
  if (root == (json_t *)0x0) {
    iVar1 = -1;
  }
  else {
    lVar2 = get_int_options_inner(root,option_name,result,1);
    iVar1 = (int)lVar2;
  }
  return iVar1;
}

Assistant:

int get_int_options(const char * json_string, const char * option_name, int * result)
{
	json_t * root;

	*result = -1;
	root = get_root_option_json_object(json_string);
	if (!root)
		return -1;
	return (int)get_int_options_inner(root, option_name, result, 1);
}